

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

void __thiscall
DatabaseSnapshot::find_all_indexed_files
          (DatabaseSnapshot *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *existing_files)

{
  pointer ppOVar1;
  pointer ppOVar2;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  ppOVar2 = (this->datasets).
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar1 = (this->datasets).
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar1) {
    local_38 = existing_files;
    do {
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:85:31)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:85:31)>
                 ::_M_manager;
      local_58._M_unused._M_object = &local_38;
      OnDiskFileIndex::for_each_filename
                ((OnDiskFileIndex *)&(*ppOVar2)->files_index,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      ppOVar2 = ppOVar2 + 1;
    } while (ppOVar2 != ppOVar1);
  }
  return;
}

Assistant:

void DatabaseSnapshot::find_all_indexed_files(
    std::set<std::string> *existing_files) const {
    for (const auto &ds : datasets) {
        ds->for_each_filename([&existing_files](const std::string &fname) {
            existing_files->insert(fname);
        });
    }
}